

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O3

int sp_dtrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,double *x,
            SuperLUStat_t *stat,int *info)

{
  double *M;
  doublereal *a;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  double *pdVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int *piVar22;
  double dVar23;
  double dVar24;
  float fVar25;
  int nsupc;
  undefined8 local_170;
  double *local_168;
  void *local_160;
  double *local_158;
  int incx;
  long local_148;
  long local_140;
  int nsupr;
  
  incx = 1;
  *info = 0;
  if ((*uplo != 'U') && (*uplo != 'L')) {
    iVar21 = 1;
    iVar14 = -1;
LAB_00110554:
    *info = iVar14;
    nsupr = iVar21;
    input_error("sp_dtrsv",&nsupr);
    return 0;
  }
  iVar21 = 2;
  iVar14 = -2;
  if ((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0))
  goto LAB_00110554;
  if ((*diag != 'U') && (*diag != 'N')) {
    iVar21 = 3;
    iVar14 = -3;
    goto LAB_00110554;
  }
  iVar1 = L->nrow;
  iVar21 = 4;
  iVar14 = -4;
  if (((long)iVar1 < 0) || (iVar1 != L->ncol)) goto LAB_00110554;
  iVar21 = 5;
  iVar14 = -5;
  if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_00110554;
  local_160 = L->Store;
  lVar5 = *(long *)((long)local_160 + 8);
  local_158 = (double *)U->Store;
  dVar23 = local_158[1];
  local_170 = U;
  local_168 = doubleCalloc((long)iVar1);
  if (local_168 == (double *)0x0) {
    sprintf((char *)&nsupr,"%s at line %d in file %s\n","Malloc fails for work in sp_dtrsv().",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c");
    superlu_abort_and_exit((char *)&nsupr);
  }
  pdVar9 = local_158;
  pdVar16 = local_168;
  if (*trans == 'N') {
    if (*uplo == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_160 + 4)) {
        local_140 = lVar5 + 8;
        fVar25 = 0.0;
        lVar11 = 0;
        pvVar17 = local_160;
        do {
          lVar19 = *(long *)((long)pvVar17 + 0x20);
          iVar21 = *(int *)(*(long *)((long)pvVar17 + 0x30) + lVar11 * 4);
          lVar10 = (long)iVar21;
          uVar2 = *(uint *)(lVar19 + lVar10 * 4);
          nsupr = *(int *)(lVar19 + 4 + lVar10 * 4) - uVar2;
          iVar21 = *(int *)(*(long *)((long)pvVar17 + 0x30) + 4 + lVar11 * 4) - iVar21;
          lVar18 = (long)*(int *)(*(long *)((long)pvVar17 + 0x10) + lVar10 * 4);
          uVar20 = nsupr - iVar21;
          nsupc = iVar21;
          if (iVar21 == 1) {
            iVar14 = *(int *)(lVar19 + 4 + lVar10 * 4);
            if ((int)((long)(int)uVar2 + 1) < iVar14) {
              lVar19 = *(long *)((long)pvVar17 + 0x18);
              lVar15 = 0;
              do {
                iVar1 = *(int *)(((long)(int)uVar2 + 1) * 4 + lVar19 + lVar15 * 4);
                x[iVar1] = x[iVar1] - x[lVar10] * *(double *)(local_140 + lVar18 * 8 + lVar15 * 8);
                lVar15 = lVar15 + 1;
              } while (~uVar2 + iVar14 != (int)lVar15);
            }
          }
          else {
            local_158 = x + lVar10;
            local_170 = (SuperMatrix *)CONCAT44(local_170._4_4_,fVar25);
            local_148 = lVar18;
            dlsolve(nsupr,iVar21,(double *)(lVar5 + lVar18 * 8),local_158);
            dmatvec(nsupr,nsupr - nsupc,nsupc,(double *)(lVar5 + (long)((int)local_148 + nsupc) * 8)
                    ,local_158,local_168);
            pdVar16 = local_168;
            pvVar17 = local_160;
            fVar25 = (float)local_170;
            if (0 < (int)uVar20) {
              lVar19 = *(long *)((long)local_160 + 0x18);
              uVar12 = 0;
              do {
                iVar14 = *(int *)((long)(int)(uVar2 + nsupc) * 4 + lVar19 + uVar12 * 4);
                x[iVar14] = x[iVar14] - local_168[uVar12];
                local_168[uVar12] = 0.0;
                uVar12 = uVar12 + 1;
              } while (uVar12 < uVar20);
            }
          }
          fVar25 = fVar25 + (float)((iVar21 + -1) * iVar21) + (float)(int)(uVar20 * iVar21 * 2);
          bVar8 = lVar11 < *(int *)((long)pvVar17 + 4);
          lVar11 = lVar11 + 1;
        } while (bVar8);
        goto LAB_001109ae;
      }
    }
    else {
      if (local_170->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_160 + 4)) {
        lVar11 = *(long *)((long)local_160 + 0x30);
        fVar25 = 0.0;
        pvVar17 = local_160;
        lVar19 = (long)*(int *)((long)local_160 + 4);
        do {
          iVar21 = *(int *)(lVar11 + lVar19 * 4);
          lVar10 = (long)iVar21;
          nsupr = *(int *)(*(long *)((long)pvVar17 + 0x20) + 4 + lVar10 * 4) -
                  *(int *)(*(long *)((long)pvVar17 + 0x20) + lVar10 * 4);
          nsupc = *(int *)(lVar11 + 4 + lVar19 * 4) - iVar21;
          fVar25 = (float)((nsupc + 1) * nsupc) + fVar25;
          M = (double *)(lVar5 + (long)*(int *)(*(long *)((long)pvVar17 + 0x10) + lVar10 * 4) * 8);
          if (nsupc == 1) {
            x[lVar10] = x[lVar10] / *M;
            iVar21 = *(int *)((long)pdVar9[3] + lVar10 * 4);
            lVar18 = (long)iVar21;
            iVar14 = *(int *)((long)pdVar9[3] + 4 + lVar10 * 4);
            if (iVar21 < iVar14) {
              dVar6 = pdVar9[2];
              do {
                iVar21 = *(int *)((long)dVar6 + lVar18 * 4);
                x[iVar21] = x[iVar21] - x[lVar10] * *(double *)((long)dVar23 + lVar18 * 8);
                lVar18 = lVar18 + 1;
              } while (iVar14 != lVar18);
            }
          }
          else {
            local_170 = (SuperMatrix *)CONCAT44(local_170._4_4_,fVar25);
            dusolve(nsupr,nsupc,M,x + lVar10);
            lVar11 = *(long *)((long)local_160 + 0x30);
            iVar14 = *(int *)(lVar11 + 4 + lVar19 * 4);
            pdVar16 = local_168;
            pvVar17 = local_160;
            fVar25 = (float)local_170;
            if (iVar21 < iVar14) {
              dVar6 = pdVar9[3];
              iVar21 = *(int *)((long)dVar6 + lVar10 * 4);
              do {
                iVar1 = *(int *)((long)dVar6 + 4 + lVar10 * 4);
                if (iVar1 - iVar21 != 0 && iVar21 <= iVar1) {
                  dVar24 = pdVar9[2];
                  lVar18 = (long)iVar21;
                  do {
                    iVar3 = *(int *)((long)dVar24 + lVar18 * 4);
                    x[iVar3] = x[iVar3] - x[lVar10] * *(double *)((long)dVar23 + lVar18 * 8);
                    lVar18 = lVar18 + 1;
                  } while (iVar1 != lVar18);
                }
                lVar10 = lVar10 + 1;
                fVar25 = fVar25 + (float)((iVar1 - iVar21) * 2);
                iVar21 = iVar1;
              } while (lVar10 != iVar14);
            }
          }
          bVar8 = 0 < lVar19;
          lVar19 = lVar19 + -1;
        } while (bVar8);
        goto LAB_001109ae;
      }
    }
  }
  else if (*uplo == 'L') {
    if (L->nrow == 0) {
      return 0;
    }
    if (-1 < (long)*(int *)((long)local_160 + 4)) {
      fVar25 = 0.0;
      lVar11 = (long)*(int *)((long)local_160 + 4);
      do {
        lVar19 = *(long *)((long)local_160 + 0x30);
        iVar21 = *(int *)(lVar19 + lVar11 * 4);
        lVar18 = (long)iVar21;
        iVar14 = *(int *)(*(long *)((long)local_160 + 0x20) + lVar18 * 4);
        nsupr = *(int *)(*(long *)((long)local_160 + 0x20) + 4 + lVar18 * 4) - iVar14;
        nsupc = *(int *)(lVar19 + 4 + lVar11 * 4) - iVar21;
        lVar10 = *(long *)((long)local_160 + 0x10);
        iVar1 = *(int *)(lVar10 + lVar18 * 4);
        local_158 = (double *)CONCAT44(local_158._4_4_,iVar1);
        iVar3 = *(int *)(lVar19 + 4 + lVar11 * 4);
        if (iVar21 < iVar3) {
          lVar19 = lVar18;
          iVar21 = iVar1;
          do {
            iVar13 = iVar21 + nsupc;
            iVar21 = *(int *)(lVar10 + 4 + lVar19 * 4);
            if (iVar13 < iVar21) {
              dVar23 = x[lVar19];
              lVar15 = (long)iVar13;
              piVar22 = (int *)(*(long *)((long)local_160 + 0x18) + (long)(iVar14 + nsupc) * 4);
              do {
                dVar23 = dVar23 - x[*piVar22] * *(double *)(lVar5 + lVar15 * 8);
                x[lVar19] = dVar23;
                lVar15 = lVar15 + 1;
                piVar22 = piVar22 + 1;
              } while (lVar15 < iVar21);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != iVar3);
        }
        fVar25 = fVar25 + (float)((nsupr - nsupc) * nsupc * 2);
        if (1 < nsupc) {
          local_170 = (SuperMatrix *)
                      CONCAT44(local_170._4_4_,fVar25 + (float)((nsupc + -1) * nsupc));
          dtrsv_("L","T","U",&nsupc,(doublereal *)(lVar5 + (long)iVar1 * 8),&nsupr,x + lVar18,&incx)
          ;
          fVar25 = (float)local_170;
        }
        bVar8 = 0 < lVar11;
        pdVar16 = local_168;
        lVar11 = lVar11 + -1;
      } while (bVar8);
      goto LAB_001109ae;
    }
  }
  else {
    if (local_170->nrow == 0) {
      return 0;
    }
    iVar21 = *(int *)((long)local_160 + 4);
    if (-1 < iVar21) {
      fVar25 = 0.0;
      lVar11 = 0;
      do {
        local_148 = CONCAT44(local_148._4_4_,iVar21);
        lVar19 = *(long *)((long)local_160 + 0x30);
        iVar14 = *(int *)(lVar19 + lVar11 * 4);
        lVar10 = (long)iVar14;
        nsupr = *(int *)(*(long *)((long)local_160 + 0x20) + 4 + lVar10 * 4) -
                *(int *)(*(long *)((long)local_160 + 0x20) + lVar10 * 4);
        iVar13 = *(int *)(lVar19 + 4 + lVar11 * 4) - iVar14;
        iVar1 = *(int *)(*(long *)((long)local_160 + 0x10) + lVar10 * 4);
        local_170 = (SuperMatrix *)(long)iVar1;
        iVar3 = *(int *)(lVar19 + 4 + lVar11 * 4);
        if (iVar14 < iVar3) {
          dVar6 = local_158[3];
          lVar19 = lVar10;
          iVar14 = *(int *)((long)dVar6 + lVar10 * 4);
          do {
            iVar4 = *(int *)((long)dVar6 + 4 + lVar19 * 4);
            if (iVar4 - iVar14 != 0 && iVar14 <= iVar4) {
              dVar7 = local_158[2];
              dVar24 = x[lVar19];
              lVar18 = (long)iVar14;
              do {
                dVar24 = dVar24 - x[*(int *)((long)dVar7 + lVar18 * 4)] *
                                  *(double *)((long)dVar23 + lVar18 * 8);
                x[lVar19] = dVar24;
                lVar18 = lVar18 + 1;
              } while (iVar4 != lVar18);
            }
            lVar19 = lVar19 + 1;
            fVar25 = fVar25 + (float)((iVar4 - iVar14) * 2);
            iVar14 = iVar4;
          } while (lVar19 != iVar3);
        }
        a = (doublereal *)(lVar5 + (long)local_170 * 8);
        nsupc = iVar13;
        if (iVar13 == 1) {
          x[lVar10] = x[lVar10] / *a;
        }
        else {
          local_170._4_4_ = iVar1 >> 0x1f;
          local_170 = (SuperMatrix *)CONCAT44(local_170._4_4_,fVar25);
          dtrsv_("U","T","N",&nsupc,a,&nsupr,x + lVar10,&incx);
          iVar21 = *(int *)((long)local_160 + 4);
          fVar25 = (float)local_170;
        }
        fVar25 = fVar25 + (float)((iVar13 + 1) * iVar13);
        bVar8 = lVar11 < iVar21;
        pdVar16 = local_168;
        lVar11 = lVar11 + 1;
      } while (bVar8);
      goto LAB_001109ae;
    }
  }
  fVar25 = 0.0;
LAB_001109ae:
  stat->ops[0x11] = fVar25 + stat->ops[0x11];
  superlu_free(pdVar16);
  return 0;
}

Assistant:

int
sp_dtrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, double *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    double   *Lval, *Uval;
    int incx = 1, incy = 1;
    double alpha = 1.0, beta = 1.0;
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    double *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_dtrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doubleCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_dtrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

	        solve_ops += nsupc * (nsupc - 1);
	        solve_ops += 2 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			x[irow] -= x[fsupc] * Lval[luptr];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    SGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    dtrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    dgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    dlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    dmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			x[irow] -= work[i];	/* Scatter */
			work[i] = 0.0;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
    	        solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			x[irow] -= x[fsupc] * Uval[i];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    dtrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    dusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			    x[irow] -= x[jcol] * Uval[i];
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 2 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			x[jcol] -= x[irow] * Lval[i];
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    dtrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			x[jcol] -= x[irow] * Uval[i];
		    }
		}

		solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    dtrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}